

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

bool __thiscall CTuningParams::Get(CTuningParams *this,char *pName,float *pValue)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  CTuningParams *in_RDI;
  int i;
  char *in_stack_ffffffffffffffb8;
  char *a;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int Index;
  
  iVar3 = 0;
  while( true ) {
    Index = iVar3;
    iVar2 = Num();
    if (iVar2 <= iVar3) {
      return false;
    }
    a = in_RSI;
    GetName(in_RDI,Index);
    iVar2 = str_comp_nocase(a,in_stack_ffffffffffffffb8);
    if (iVar2 == 0) break;
    iVar3 = Index + 1;
  }
  bVar1 = Get((CTuningParams *)CONCAT44(Index,in_stack_ffffffffffffffd8),
              (int)((ulong)in_RDI >> 0x20),(float *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
  return bVar1;
}

Assistant:

bool CTuningParams::Get(const char *pName, float *pValue) const
{
	for(int i = 0; i < Num(); i++)
		if(str_comp_nocase(pName, GetName(i)) == 0)
			return Get(i, pValue);
	return false;
}